

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O3

int tagFUNCTION::CompareFunctionName(wchar_t *a,int a_count,wchar_t *b)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  
  if (0 < a_count) {
    lVar2 = 0;
    do {
      uVar1 = *(uint *)((long)a + lVar2);
      uVar3 = uVar1 | 0x20;
      if (0x19 < uVar1 - 0x41) {
        uVar3 = uVar1;
      }
      if ((int)uVar3 < *(int *)((long)b + lVar2)) {
        return -1;
      }
      if (*(int *)((long)b + lVar2) < (int)uVar3) {
        return 1;
      }
      if (uVar3 == 0) {
        return 0;
      }
      lVar2 = lVar2 + 4;
    } while ((ulong)(uint)a_count << 2 != lVar2);
    b = (wchar_t *)((long)b + lVar2);
  }
  if (L'\0' < *b) {
    return -1;
  }
  return (int)(*b != L'\0');
}

Assistant:

static int CompareFunctionName(
    const wchar_t* a,
    int a_count,
    const wchar_t* b
    )
  {
    wchar_t c, d=0;
    for ( int a_index = 0; a_index < a_count; a_index++ )
    {
      c = a[a_index];
      d = *b++;
      if ( c >= 'A' && c <= 'Z' )
        c += 'a'-'A';
      if ( c < d )
        return -1;
      if ( c > d )
        return 1;
      if ( 0 == c )
        return 0;
    }
    d = *b++;
    if ( 0 < d )
      return -1;
    if ( 0 > d )
      return 1;
    return 0;
  }